

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linei_intersector.h
# Opt level: O1

bool embree::avx::FlatLinearCurveMiIntersectorK<8,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  undefined4 uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  Scene *pSVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  ulong uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  bool bVar26;
  float fVar27;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  float fVar36;
  undefined1 auVar30 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar37;
  float fVar43;
  float fVar44;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  float fVar45;
  undefined1 auVar42 [32];
  float fVar49;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  float fVar71;
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  undefined1 auVar72 [64];
  float fVar73;
  float fVar79;
  undefined1 auVar74 [16];
  float fVar77;
  float fVar78;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar75 [32];
  undefined1 auVar76 [64];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  float in_register_000014dc;
  undefined1 auVar85 [32];
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar89 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  LineIntersectorHitM<8> hit;
  undefined8 local_360;
  undefined8 uStack_358;
  size_t local_348;
  undefined1 local_340 [32];
  RTCFilterFunctionNArguments local_310;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  RTCHitN local_290 [16];
  undefined1 local_280 [16];
  undefined1 local_270 [16];
  undefined1 local_260 [16];
  undefined1 local_250 [16];
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  uint local_220;
  uint uStack_21c;
  uint uStack_218;
  uint uStack_214;
  uint uStack_210;
  uint uStack_20c;
  uint uStack_208;
  uint uStack_204;
  undefined1 local_200 [16];
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [2] [32];
  
  pSVar10 = context->scene;
  uVar24 = line->sharedGeomID;
  uVar2 = (line->v0).field_0.i[0];
  pGVar11 = (pSVar10->geometries).items[uVar24].ptr;
  lVar23 = *(long *)&pGVar11[1].time_range.upper;
  p_Var12 = pGVar11[1].intersectionFilterN;
  uVar3 = (line->v0).field_0.i[1];
  uVar4 = (line->v0).field_0.i[4];
  auVar28._16_16_ = *(undefined1 (*) [16])(lVar23 + (ulong)uVar4 * (long)p_Var12);
  auVar28._0_16_ = *(undefined1 (*) [16])(lVar23 + (ulong)uVar2 * (long)p_Var12);
  uVar5 = (line->v0).field_0.i[2];
  uVar6 = (line->v0).field_0.i[3];
  uVar7 = (line->v0).field_0.i[5];
  auVar40._16_16_ = *(undefined1 (*) [16])(lVar23 + (ulong)uVar7 * (long)p_Var12);
  auVar40._0_16_ = *(undefined1 (*) [16])(lVar23 + (ulong)uVar3 * (long)p_Var12);
  uVar8 = (line->v0).field_0.i[6];
  auVar50._16_16_ = *(undefined1 (*) [16])(lVar23 + (ulong)uVar8 * (long)p_Var12);
  auVar50._0_16_ = *(undefined1 (*) [16])(lVar23 + (ulong)uVar5 * (long)p_Var12);
  uVar9 = (line->v0).field_0.i[7];
  auVar58._16_16_ = *(undefined1 (*) [16])(lVar23 + (ulong)uVar9 * (long)p_Var12);
  auVar58._0_16_ = *(undefined1 (*) [16])(lVar23 + (ulong)uVar6 * (long)p_Var12);
  auVar61._16_16_ = *(undefined1 (*) [16])(lVar23 + (ulong)(uVar4 + 1) * (long)p_Var12);
  auVar61._0_16_ = *(undefined1 (*) [16])(lVar23 + (ulong)(uVar2 + 1) * (long)p_Var12);
  auVar64._16_16_ = *(undefined1 (*) [16])(lVar23 + (ulong)(uVar7 + 1) * (long)p_Var12);
  auVar64._0_16_ = *(undefined1 (*) [16])(lVar23 + (ulong)(uVar3 + 1) * (long)p_Var12);
  auVar66._16_16_ = *(undefined1 (*) [16])(lVar23 + (ulong)(uVar8 + 1) * (long)p_Var12);
  auVar66._0_16_ = *(undefined1 (*) [16])(lVar23 + (ulong)(uVar5 + 1) * (long)p_Var12);
  auVar75._16_16_ = *(undefined1 (*) [16])(lVar23 + (ulong)(uVar9 + 1) * (long)p_Var12);
  auVar75._0_16_ = *(undefined1 (*) [16])(lVar23 + (ulong)(uVar6 + 1) * (long)p_Var12);
  auVar16 = vunpcklps_avx(auVar28,auVar50);
  auVar14 = vunpckhps_avx(auVar28,auVar50);
  auVar89 = vunpcklps_avx(auVar40,auVar58);
  auVar15 = vunpckhps_avx(auVar40,auVar58);
  auVar28 = vunpcklps_avx(auVar16,auVar89);
  local_2c0 = vunpckhps_avx(auVar16,auVar89);
  local_1e0 = vunpcklps_avx(auVar14,auVar15);
  local_160 = vunpckhps_avx(auVar14,auVar15);
  auVar16 = vunpcklps_avx(auVar61,auVar66);
  auVar14 = vunpckhps_avx(auVar61,auVar66);
  auVar89 = vunpcklps_avx(auVar64,auVar75);
  auVar15 = vunpckhps_avx(auVar64,auVar75);
  local_1a0 = vunpcklps_avx(auVar16,auVar89);
  local_1c0 = vunpckhps_avx(auVar16,auVar89);
  local_2e0 = vunpcklps_avx(auVar14,auVar15);
  auVar38 = vpcmpeqd_avx(local_2e0._0_16_,local_2e0._0_16_);
  auVar39 = vpcmpeqd_avx(auVar38,*(undefined1 (*) [16])(line->primIDs).field_0.field_1.vl);
  auVar38 = vpcmpeqd_avx(auVar38,*(undefined1 (*) [16])((long)&(line->primIDs).field_0 + 0x10));
  local_180 = vunpckhps_avx(auVar14,auVar15);
  local_140._16_16_ = auVar38;
  local_140._0_16_ = auVar39;
  local_1f0 = vshufps_avx(ZEXT416(uVar24),ZEXT416(uVar24),0);
  local_200 = local_1f0;
  fVar49 = pre->ray_space[k].vy.field_0.m128[0];
  fVar27 = pre->ray_space[k].vy.field_0.m128[1];
  fVar31 = pre->ray_space[k].vz.field_0.m128[0];
  fVar32 = pre->ray_space[k].vz.field_0.m128[1];
  fVar71 = *(float *)(ray + k * 4 + 0x10);
  auVar68._4_4_ = fVar71;
  auVar68._0_4_ = fVar71;
  auVar68._8_4_ = fVar71;
  auVar68._12_4_ = fVar71;
  auVar68._16_4_ = fVar71;
  auVar68._20_4_ = fVar71;
  auVar68._24_4_ = fVar71;
  auVar68._28_4_ = fVar71;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
  auVar41._4_4_ = uVar1;
  auVar41._0_4_ = uVar1;
  auVar41._8_4_ = uVar1;
  auVar41._12_4_ = uVar1;
  auVar41._16_4_ = uVar1;
  auVar41._20_4_ = uVar1;
  auVar41._24_4_ = uVar1;
  auVar41._28_4_ = uVar1;
  auVar14 = vsubps_avx(local_2c0,auVar68);
  auVar15 = vsubps_avx(local_1e0,auVar41);
  fVar46 = auVar15._0_4_;
  fVar47 = auVar15._4_4_;
  fVar48 = auVar15._8_4_;
  fVar43 = auVar15._12_4_;
  fVar45 = auVar15._16_4_;
  fVar53 = auVar15._20_4_;
  fVar86 = auVar15._24_4_;
  fVar56 = auVar14._0_4_;
  fVar57 = auVar14._4_4_;
  fVar37 = auVar14._8_4_;
  fVar44 = auVar14._12_4_;
  fVar52 = auVar14._16_4_;
  fVar54 = auVar14._20_4_;
  fVar87 = auVar14._24_4_;
  fVar33 = pre->ray_space[k].vy.field_0.m128[2];
  fVar34 = pre->ray_space[k].vz.field_0.m128[2];
  fVar88 = auVar15._28_4_;
  fVar35 = pre->ray_space[k].vx.field_0.m128[0];
  uVar1 = *(undefined4 *)(ray + k * 4);
  auVar67._4_4_ = uVar1;
  auVar67._0_4_ = uVar1;
  auVar67._8_4_ = uVar1;
  auVar67._12_4_ = uVar1;
  auVar67._16_4_ = uVar1;
  auVar67._20_4_ = uVar1;
  auVar67._24_4_ = uVar1;
  auVar67._28_4_ = uVar1;
  auVar15 = vsubps_avx(auVar28,auVar67);
  fVar73 = auVar15._0_4_;
  fVar77 = auVar15._4_4_;
  fVar78 = auVar15._8_4_;
  fVar79 = auVar15._12_4_;
  fVar80 = auVar15._16_4_;
  fVar81 = auVar15._20_4_;
  fVar82 = auVar15._24_4_;
  auVar51._0_4_ = fVar73 * fVar35 + fVar31 * fVar46 + fVar49 * fVar56;
  auVar51._4_4_ = fVar77 * fVar35 + fVar31 * fVar47 + fVar49 * fVar57;
  auVar51._8_4_ = fVar78 * fVar35 + fVar31 * fVar48 + fVar49 * fVar37;
  auVar51._12_4_ = fVar79 * fVar35 + fVar31 * fVar43 + fVar49 * fVar44;
  auVar51._16_4_ = fVar80 * fVar35 + fVar31 * fVar45 + fVar49 * fVar52;
  auVar51._20_4_ = fVar81 * fVar35 + fVar31 * fVar53 + fVar49 * fVar54;
  auVar51._24_4_ = fVar82 * fVar35 + fVar31 * fVar86 + fVar49 * fVar87;
  auVar51._28_4_ = fVar88 + in_register_000014dc + local_2c0._28_4_;
  fVar36 = pre->ray_space[k].vx.field_0.m128[1];
  auVar83._0_4_ = fVar73 * fVar36 + fVar27 * fVar56 + fVar32 * fVar46;
  auVar83._4_4_ = fVar77 * fVar36 + fVar27 * fVar57 + fVar32 * fVar47;
  auVar83._8_4_ = fVar78 * fVar36 + fVar27 * fVar37 + fVar32 * fVar48;
  auVar83._12_4_ = fVar79 * fVar36 + fVar27 * fVar44 + fVar32 * fVar43;
  auVar83._16_4_ = fVar80 * fVar36 + fVar27 * fVar52 + fVar32 * fVar45;
  auVar83._20_4_ = fVar81 * fVar36 + fVar27 * fVar54 + fVar32 * fVar53;
  auVar83._24_4_ = fVar82 * fVar36 + fVar27 * fVar87 + fVar32 * fVar86;
  auVar83._28_4_ = fVar88 + local_1e0._28_4_ + in_register_000014dc;
  fVar55 = pre->ray_space[k].vx.field_0.m128[2];
  auVar85._0_4_ = fVar55 * fVar73 + fVar56 * fVar33 + fVar46 * fVar34;
  auVar85._4_4_ = fVar55 * fVar77 + fVar57 * fVar33 + fVar47 * fVar34;
  auVar85._8_4_ = fVar55 * fVar78 + fVar37 * fVar33 + fVar48 * fVar34;
  auVar85._12_4_ = fVar55 * fVar79 + fVar44 * fVar33 + fVar43 * fVar34;
  auVar85._16_4_ = fVar55 * fVar80 + fVar52 * fVar33 + fVar45 * fVar34;
  auVar85._20_4_ = fVar55 * fVar81 + fVar54 * fVar33 + fVar53 * fVar34;
  auVar85._24_4_ = fVar55 * fVar82 + fVar87 * fVar33 + fVar86 * fVar34;
  auVar85._28_4_ = auVar15._28_4_ + auVar14._28_4_ + fVar88;
  auVar14 = vsubps_avx(local_2e0,auVar41);
  fVar46 = auVar14._0_4_;
  fVar57 = auVar14._4_4_;
  fVar43 = auVar14._8_4_;
  fVar52 = auVar14._12_4_;
  fVar86 = auVar14._16_4_;
  fVar73 = auVar14._20_4_;
  fVar79 = auVar14._24_4_;
  auVar15 = vsubps_avx(local_1c0,auVar68);
  fVar56 = auVar15._0_4_;
  fVar48 = auVar15._4_4_;
  fVar44 = auVar15._8_4_;
  fVar53 = auVar15._12_4_;
  fVar87 = auVar15._16_4_;
  fVar77 = auVar15._20_4_;
  fVar80 = auVar15._24_4_;
  fVar71 = local_2e0._28_4_ + fVar71;
  auVar16 = vsubps_avx(local_1a0,auVar67);
  fVar47 = auVar16._0_4_;
  fVar37 = auVar16._4_4_;
  fVar45 = auVar16._8_4_;
  fVar54 = auVar16._12_4_;
  fVar88 = auVar16._16_4_;
  fVar78 = auVar16._20_4_;
  fVar81 = auVar16._24_4_;
  auVar62._0_4_ = fVar35 * fVar47 + fVar31 * fVar46 + fVar49 * fVar56;
  auVar62._4_4_ = fVar35 * fVar37 + fVar31 * fVar57 + fVar49 * fVar48;
  auVar62._8_4_ = fVar35 * fVar45 + fVar31 * fVar43 + fVar49 * fVar44;
  auVar62._12_4_ = fVar35 * fVar54 + fVar31 * fVar52 + fVar49 * fVar53;
  auVar62._16_4_ = fVar35 * fVar88 + fVar31 * fVar86 + fVar49 * fVar87;
  auVar62._20_4_ = fVar35 * fVar78 + fVar31 * fVar73 + fVar49 * fVar77;
  auVar62._24_4_ = fVar35 * fVar81 + fVar31 * fVar79 + fVar49 * fVar80;
  auVar62._28_4_ = auVar15._28_4_ + fVar71;
  auVar65._0_4_ = fVar27 * fVar56 + fVar32 * fVar46 + fVar36 * fVar47;
  auVar65._4_4_ = fVar27 * fVar48 + fVar32 * fVar57 + fVar36 * fVar37;
  auVar65._8_4_ = fVar27 * fVar44 + fVar32 * fVar43 + fVar36 * fVar45;
  auVar65._12_4_ = fVar27 * fVar53 + fVar32 * fVar52 + fVar36 * fVar54;
  auVar65._16_4_ = fVar27 * fVar87 + fVar32 * fVar86 + fVar36 * fVar88;
  auVar65._20_4_ = fVar27 * fVar77 + fVar32 * fVar73 + fVar36 * fVar78;
  auVar65._24_4_ = fVar27 * fVar80 + fVar32 * fVar79 + fVar36 * fVar81;
  auVar65._28_4_ = local_2e0._28_4_ + fVar31 + fVar36;
  auVar29._0_4_ = fVar55 * fVar47 + fVar33 * fVar56 + fVar34 * fVar46;
  auVar29._4_4_ = fVar55 * fVar37 + fVar33 * fVar48 + fVar34 * fVar57;
  auVar29._8_4_ = fVar55 * fVar45 + fVar33 * fVar44 + fVar34 * fVar43;
  auVar29._12_4_ = fVar55 * fVar54 + fVar33 * fVar53 + fVar34 * fVar52;
  auVar29._16_4_ = fVar55 * fVar88 + fVar33 * fVar87 + fVar34 * fVar86;
  auVar29._20_4_ = fVar55 * fVar78 + fVar33 * fVar77 + fVar34 * fVar73;
  auVar29._24_4_ = fVar55 * fVar81 + fVar33 * fVar80 + fVar34 * fVar79;
  auVar29._28_4_ = fVar36 + fVar33 + auVar14._28_4_;
  auVar15 = vsubps_avx(auVar62,auVar51);
  auVar14 = vsubps_avx(auVar65,auVar83);
  fVar49 = auVar14._0_4_;
  fVar31 = auVar14._4_4_;
  fVar33 = auVar14._8_4_;
  fVar35 = auVar14._12_4_;
  fVar55 = auVar14._16_4_;
  fVar56 = auVar14._20_4_;
  fVar57 = auVar14._24_4_;
  fVar27 = auVar15._0_4_;
  fVar32 = auVar15._4_4_;
  fVar34 = auVar15._8_4_;
  fVar36 = auVar15._12_4_;
  fVar46 = auVar15._16_4_;
  fVar47 = auVar15._20_4_;
  fVar48 = auVar15._24_4_;
  auVar63._0_4_ = fVar27 * fVar27 + fVar49 * fVar49;
  auVar63._4_4_ = fVar32 * fVar32 + fVar31 * fVar31;
  auVar63._8_4_ = fVar34 * fVar34 + fVar33 * fVar33;
  auVar63._12_4_ = fVar36 * fVar36 + fVar35 * fVar35;
  auVar63._16_4_ = fVar46 * fVar46 + fVar55 * fVar55;
  auVar63._20_4_ = fVar47 * fVar47 + fVar56 * fVar56;
  auVar63._24_4_ = fVar48 * fVar48 + fVar57 * fVar57;
  auVar63._28_4_ = auVar65._28_4_ + auVar62._28_4_;
  auVar16._4_4_ = fVar31 * -auVar83._4_4_;
  auVar16._0_4_ = fVar49 * -auVar83._0_4_;
  auVar16._8_4_ = fVar33 * -auVar83._8_4_;
  auVar16._12_4_ = fVar35 * -auVar83._12_4_;
  auVar16._16_4_ = fVar55 * -auVar83._16_4_;
  auVar16._20_4_ = fVar56 * -auVar83._20_4_;
  auVar16._24_4_ = fVar57 * -auVar83._24_4_;
  auVar16._28_4_ = -auVar83._28_4_;
  auVar14 = vrcpps_avx(auVar63);
  auVar89._4_4_ = auVar51._4_4_ * fVar32;
  auVar89._0_4_ = auVar51._0_4_ * fVar27;
  auVar89._8_4_ = auVar51._8_4_ * fVar34;
  auVar89._12_4_ = auVar51._12_4_ * fVar36;
  auVar89._16_4_ = auVar51._16_4_ * fVar46;
  auVar89._20_4_ = auVar51._20_4_ * fVar47;
  auVar89._24_4_ = auVar51._24_4_ * fVar48;
  auVar89._28_4_ = fVar71;
  auVar16 = vsubps_avx(auVar16,auVar89);
  auVar69._8_4_ = 0x3f800000;
  auVar69._0_8_ = &DAT_3f8000003f800000;
  auVar69._12_4_ = 0x3f800000;
  auVar69._16_4_ = 0x3f800000;
  auVar69._20_4_ = 0x3f800000;
  auVar69._24_4_ = 0x3f800000;
  auVar69._28_4_ = 0x3f800000;
  fVar71 = auVar14._0_4_;
  fVar37 = auVar14._4_4_;
  auVar17._4_4_ = fVar37 * auVar63._4_4_;
  auVar17._0_4_ = fVar71 * auVar63._0_4_;
  fVar43 = auVar14._8_4_;
  auVar17._8_4_ = fVar43 * auVar63._8_4_;
  fVar44 = auVar14._12_4_;
  auVar17._12_4_ = fVar44 * auVar63._12_4_;
  fVar45 = auVar14._16_4_;
  auVar17._16_4_ = fVar45 * auVar63._16_4_;
  fVar52 = auVar14._20_4_;
  auVar17._20_4_ = fVar52 * auVar63._20_4_;
  fVar53 = auVar14._24_4_;
  auVar17._24_4_ = fVar53 * auVar63._24_4_;
  auVar17._28_4_ = auVar63._28_4_;
  auVar89 = vsubps_avx(auVar69,auVar17);
  auVar18._4_4_ = auVar16._4_4_ * (fVar37 + fVar37 * auVar89._4_4_);
  auVar18._0_4_ = auVar16._0_4_ * (fVar71 + fVar71 * auVar89._0_4_);
  auVar18._8_4_ = auVar16._8_4_ * (fVar43 + fVar43 * auVar89._8_4_);
  auVar18._12_4_ = auVar16._12_4_ * (fVar44 + fVar44 * auVar89._12_4_);
  auVar18._16_4_ = auVar16._16_4_ * (fVar45 + fVar45 * auVar89._16_4_);
  auVar18._20_4_ = auVar16._20_4_ * (fVar52 + fVar52 * auVar89._20_4_);
  auVar18._24_4_ = auVar16._24_4_ * (fVar53 + fVar53 * auVar89._24_4_);
  auVar18._28_4_ = auVar14._28_4_ + auVar89._28_4_;
  auVar14 = vminps_avx(auVar18,auVar69);
  auVar89 = ZEXT1232(ZEXT412(0)) << 0x20;
  local_120 = vmaxps_avx(auVar14,auVar89);
  fVar71 = local_120._0_4_;
  fVar86 = local_120._4_4_;
  fVar87 = local_120._8_4_;
  fVar88 = local_120._12_4_;
  fVar73 = local_120._16_4_;
  fVar77 = local_120._20_4_;
  fVar78 = local_120._24_4_;
  fVar37 = auVar51._0_4_ + fVar71 * fVar27;
  fVar43 = auVar51._4_4_ + fVar86 * fVar32;
  fVar44 = auVar51._8_4_ + fVar87 * fVar34;
  fVar45 = auVar51._12_4_ + fVar88 * fVar36;
  fVar46 = auVar51._16_4_ + fVar73 * fVar46;
  fVar47 = auVar51._20_4_ + fVar77 * fVar47;
  fVar48 = auVar51._24_4_ + fVar78 * fVar48;
  fVar49 = auVar83._0_4_ + fVar71 * fVar49;
  fVar52 = auVar83._4_4_ + fVar86 * fVar31;
  fVar53 = auVar83._8_4_ + fVar87 * fVar33;
  fVar54 = auVar83._12_4_ + fVar88 * fVar35;
  fVar55 = auVar83._16_4_ + fVar73 * fVar55;
  fVar56 = auVar83._20_4_ + fVar77 * fVar56;
  fVar57 = auVar83._24_4_ + fVar78 * fVar57;
  auVar14 = vsubps_avx(auVar29,auVar85);
  auVar74._0_4_ = auVar85._0_4_ + fVar71 * auVar14._0_4_;
  auVar74._4_4_ = auVar85._4_4_ + fVar86 * auVar14._4_4_;
  auVar74._8_4_ = auVar85._8_4_ + fVar87 * auVar14._8_4_;
  auVar74._12_4_ = auVar85._12_4_ + fVar88 * auVar14._12_4_;
  local_e0._16_4_ = auVar85._16_4_ + fVar73 * auVar14._16_4_;
  local_e0._0_16_ = auVar74;
  local_e0._20_4_ = auVar85._20_4_ + fVar77 * auVar14._20_4_;
  local_e0._24_4_ = auVar85._24_4_ + fVar78 * auVar14._24_4_;
  local_e0._28_4_ = auVar85._28_4_ + auVar14._28_4_;
  auVar14 = vsubps_avx(local_180,local_160);
  fVar27 = local_160._0_4_ + fVar71 * auVar14._0_4_;
  fVar31 = local_160._4_4_ + fVar86 * auVar14._4_4_;
  fVar32 = local_160._8_4_ + fVar87 * auVar14._8_4_;
  fVar71 = local_160._12_4_ + fVar88 * auVar14._12_4_;
  fVar33 = local_160._16_4_ + fVar73 * auVar14._16_4_;
  fVar34 = local_160._20_4_ + fVar77 * auVar14._20_4_;
  fVar35 = local_160._24_4_ + fVar78 * auVar14._24_4_;
  fVar36 = local_160._28_4_ + auVar14._28_4_;
  auVar42._0_4_ = fVar37 * fVar37 + fVar49 * fVar49;
  auVar42._4_4_ = fVar43 * fVar43 + fVar52 * fVar52;
  auVar42._8_4_ = fVar44 * fVar44 + fVar53 * fVar53;
  auVar42._12_4_ = fVar45 * fVar45 + fVar54 * fVar54;
  auVar42._16_4_ = fVar46 * fVar46 + fVar55 * fVar55;
  auVar42._20_4_ = fVar47 * fVar47 + fVar56 * fVar56;
  auVar42._24_4_ = fVar48 * fVar48 + fVar57 * fVar57;
  auVar42._28_4_ = auVar51._28_4_ + auVar15._28_4_ + auVar83._28_4_ + auVar51._28_4_;
  auVar14._4_4_ = fVar31 * fVar31;
  auVar14._0_4_ = fVar27 * fVar27;
  auVar14._8_4_ = fVar32 * fVar32;
  auVar14._12_4_ = fVar71 * fVar71;
  auVar14._16_4_ = fVar33 * fVar33;
  auVar14._20_4_ = fVar34 * fVar34;
  auVar14._24_4_ = fVar35 * fVar35;
  auVar14._28_4_ = auVar83._28_4_ + auVar51._28_4_;
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar59._4_4_ = uVar1;
  auVar59._0_4_ = uVar1;
  auVar59._8_4_ = uVar1;
  auVar59._12_4_ = uVar1;
  auVar59._16_4_ = uVar1;
  auVar59._20_4_ = uVar1;
  auVar59._24_4_ = uVar1;
  auVar59._28_4_ = uVar1;
  auVar15 = vcmpps_avx(auVar42,auVar14,2);
  auVar14 = vcmpps_avx(auVar59,local_e0,2);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar60._4_4_ = uVar1;
  auVar60._0_4_ = uVar1;
  auVar60._8_4_ = uVar1;
  auVar60._12_4_ = uVar1;
  auVar60._16_4_ = uVar1;
  auVar60._20_4_ = uVar1;
  auVar60._24_4_ = uVar1;
  auVar60._28_4_ = uVar1;
  auVar16 = vcmpps_avx(local_e0,auVar60,2);
  auVar14 = vandps_avx(auVar16,auVar14);
  fVar49 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
  auVar14 = vandps_avx(auVar14,auVar15);
  auVar15._4_4_ = fVar49 * (fVar31 + fVar31);
  auVar15._0_4_ = fVar49 * (fVar27 + fVar27);
  auVar15._8_4_ = fVar49 * (fVar32 + fVar32);
  auVar15._12_4_ = fVar49 * (fVar71 + fVar71);
  auVar15._16_4_ = fVar49 * (fVar33 + fVar33);
  auVar15._20_4_ = fVar49 * (fVar34 + fVar34);
  auVar15._24_4_ = fVar49 * (fVar35 + fVar35);
  auVar15._28_4_ = fVar36 + fVar36;
  auVar15 = vcmpps_avx(local_e0,auVar15,6);
  auVar14 = vandps_avx(auVar15,auVar14);
  auVar38 = vpslld_avx(auVar14._0_16_,0x1f);
  auVar39 = vpsrad_avx(auVar38,0x1f);
  auVar38 = vpslld_avx(auVar14._16_16_,0x1f);
  auVar38 = vpsrad_avx(auVar38,0x1f);
  auVar30._16_16_ = auVar38;
  auVar30._0_16_ = auVar39;
  auVar14 = auVar30 & ~local_140;
  if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar14 >> 0x7f,0) != '\0') ||
        (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar14 >> 0xbf,0) != '\0') ||
      (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar14[0x1f] < '\0') {
    auVar14 = vandnps_avx(local_140,auVar30);
    local_c0 = vsubps_avx(local_1a0,auVar28);
    local_a0 = vsubps_avx(local_1c0,local_2c0);
    local_80[0] = vsubps_avx(local_2e0,local_1e0);
    auVar15 = vcmpps_avx(auVar89,local_c0,4);
    auVar89 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar16 = vcmpps_avx(auVar89,local_a0,4);
    auVar16 = vorps_avx(auVar15,auVar16);
    auVar15 = vcmpps_avx(auVar89,local_80[0],4);
    auVar15 = vorps_avx(auVar16,auVar15);
    auVar16 = auVar14 & auVar15;
    if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar16 >> 0x7f,0) != '\0') ||
          (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar16 >> 0xbf,0) != '\0') ||
        (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar16[0x1f] < '\0')
    {
      auVar14 = vandps_avx(auVar15,auVar14);
      local_100 = ZEXT832(0) << 0x20;
      uVar24 = vmovmskps_avx(auVar14);
      uVar25 = (ulong)uVar24;
      lVar23 = (long)(1 << ((byte)k & 0x1f)) * 0x10;
      auVar14 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar70 = ZEXT3264(auVar14);
      auVar72 = ZEXT464(0) << 0x20;
      auVar38 = vpcmpeqd_avx(auVar74,auVar74);
      auVar76 = ZEXT1664(auVar38);
      auVar84 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
      local_348 = k;
      do {
        local_310.hit = local_290;
        local_310.valid = (int *)&local_360;
        uVar13 = 0;
        if (uVar25 != 0) {
          for (; (uVar25 >> uVar13 & 1) == 0; uVar13 = uVar13 + 1) {
          }
        }
        uVar24 = *(uint *)(local_200 + uVar13 * 4);
        pGVar11 = (pSVar10->geometries).items[uVar24].ptr;
        if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
          uVar25 = uVar25 ^ 1L << (uVar13 & 0x3f);
          bVar26 = true;
        }
        else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          bVar26 = false;
        }
        else {
          local_2e0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
          uVar1 = *(undefined4 *)(local_120 + uVar13 * 4);
          local_260._4_4_ = uVar1;
          local_260._0_4_ = uVar1;
          local_260._8_4_ = uVar1;
          local_260._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_100 + uVar13 * 4);
          local_250._4_4_ = uVar1;
          local_250._0_4_ = uVar1;
          local_250._8_4_ = uVar1;
          local_250._12_4_ = uVar1;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_e0 + uVar13 * 4);
          local_310.context = context->user;
          local_230 = vpshufd_avx(ZEXT416(uVar24),0);
          uVar24 = (line->primIDs).field_0.i[uVar13];
          local_240._4_4_ = uVar24;
          local_240._0_4_ = uVar24;
          local_240._8_4_ = uVar24;
          local_240._12_4_ = uVar24;
          uVar1 = *(undefined4 *)(local_c0 + uVar13 * 4);
          local_290._4_4_ = uVar1;
          local_290._0_4_ = uVar1;
          local_290._8_4_ = uVar1;
          local_290._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_a0 + uVar13 * 4);
          local_280._4_4_ = uVar1;
          local_280._0_4_ = uVar1;
          local_280._8_4_ = uVar1;
          local_280._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(local_80[0] + uVar13 * 4);
          local_270._4_4_ = uVar1;
          local_270._0_4_ = uVar1;
          local_270._8_4_ = uVar1;
          local_270._12_4_ = uVar1;
          local_340 = auVar70._0_32_;
          uStack_21c = (local_310.context)->instID[0];
          local_220 = uStack_21c;
          uStack_218 = uStack_21c;
          uStack_214 = uStack_21c;
          uStack_210 = (local_310.context)->instPrimID[0];
          uStack_20c = uStack_210;
          uStack_208 = uStack_210;
          uStack_204 = uStack_210;
          local_360 = *(undefined8 *)(mm_lookupmask_ps + lVar23);
          uStack_358 = *(undefined8 *)(mm_lookupmask_ps + lVar23 + 8);
          local_310.geometryUserPtr = pGVar11->userPtr;
          local_310.N = 4;
          local_310.ray = (RTCRayN *)ray;
          if (pGVar11->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar38 = auVar76._0_16_;
            (*pGVar11->occlusionFilterN)(&local_310);
            auVar84 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
            auVar38 = vpcmpeqd_avx(auVar38,auVar38);
            auVar76 = ZEXT1664(auVar38);
            auVar72 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar70 = ZEXT3264(local_340);
            k = local_348;
          }
          auVar39._8_8_ = uStack_358;
          auVar39._0_8_ = local_360;
          auVar38 = auVar76._0_16_;
          if (auVar39 == (undefined1  [16])0x0) {
            auVar39 = vpcmpeqd_avx(auVar72._0_16_,(undefined1  [16])0x0);
            auVar38 = auVar38 ^ auVar39;
          }
          else {
            p_Var12 = context->args->filter;
            if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var12)(&local_310);
              auVar84 = ZEXT1664(CONCAT412(0xff800000,CONCAT48(0xff800000,0xff800000ff800000)));
              auVar38 = vpcmpeqd_avx(auVar38,auVar38);
              auVar76 = ZEXT1664(auVar38);
              auVar72 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar70 = ZEXT3264(local_340);
            }
            auVar38._8_8_ = uStack_358;
            auVar38._0_8_ = local_360;
            auVar39 = vpcmpeqd_avx(auVar72._0_16_,auVar38);
            auVar38 = auVar76._0_16_ ^ auVar39;
            auVar39 = vblendvps_avx(auVar84._0_16_,*(undefined1 (*) [16])(local_310.ray + 0x80),
                                    auVar39);
            *(undefined1 (*) [16])(local_310.ray + 0x80) = auVar39;
          }
          auVar38 = vpslld_avx(auVar38,0x1f);
          bVar21 = (auVar38 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar22 = (auVar38 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar20 = (auVar38 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0;
          bVar19 = -1 < auVar38[0xf];
          bVar26 = ((bVar21 && bVar22) && bVar20) && bVar19;
          if (((bVar21 && bVar22) && bVar20) && bVar19) {
            *(undefined4 *)(ray + k * 4 + 0x80) = local_2e0._0_4_;
            uVar25 = uVar25 ^ 1L << (uVar13 & 0x3f);
          }
        }
      } while ((bVar26 != false) && (uVar25 != 0));
      return (bool)(bVar26 ^ 1);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; line.gather(v0,v1,geom);
        const vbool<M> valid = line.valid();
        return FlatLinearCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }